

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

double max_diff(vec *a,vec *b)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar4 = 0.0;
  for (uVar2 = 0; uVar3 = (ulong)uVar2,
      uVar3 < (ulong)((long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar2 = uVar2 + 1) {
    dVar5 = ABS(pdVar1[uVar3] -
                (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3]);
    if (dVar5 <= dVar4) {
      dVar5 = dVar4;
    }
    dVar4 = dVar5;
  }
  return dVar4;
}

Assistant:

double max_diff(const vec& a, const vec& b)
{
    double max_diff = 0.0;
    for (unsigned int i = 0; i < a.size(); i++)
    {
        double diff = std::abs(a[i] - b[i]);
        if (diff > max_diff)
        {
            max_diff = diff;
        }
    }

    return max_diff;
}